

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::updateStandaloneQualifierDefaults
          (HlslParseContext *this,TSourceLoc *loc,TPublicType *publicType)

{
  TLayoutGeometry TVar1;
  TVertexSpacing TVar2;
  TVertexOrder TVar3;
  TIntermediate *pTVar4;
  ulong uVar5;
  pointer pTVar6;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar7;
  undefined4 extraout_var;
  long lVar8;
  undefined4 extraout_var_00;
  long *plVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  char *pcVar13;
  uint uVar14;
  char *pcVar15;
  _func_int **pp_Var16;
  long lVar17;
  int iVar18;
  
  if (((publicType->shaderQualifiers).vertices != -1) &&
     (((this->super_TParseContextBase).super_TParseVersions.language | EShLangTessEvaluation) !=
      EShLangGeometry)) {
    __assert_fail("language == EShLangTessControl || language == EShLangGeometry",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                  ,0x242c,
                  "void glslang::HlslParseContext::updateStandaloneQualifierDefaults(const TSourceLoc &, const TPublicType &)"
                 );
  }
  iVar18 = (publicType->shaderQualifiers).invocations;
  if (iVar18 != -1) {
    pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar7 = pTVar4->invocations;
    if (iVar7 == -1) {
      pTVar4->invocations = iVar18;
    }
    else if (iVar7 != iVar18) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot change previously set layout value","invocations","");
    }
  }
  TVar1 = (publicType->shaderQualifiers).geometry;
  if ((long)(int)TVar1 == 0) goto LAB_003987a1;
  uVar11 = (uint)*(undefined8 *)&(publicType->qualifier).field_0x8;
  uVar14 = uVar11 & 0x7f;
  if (uVar14 == 4) {
    handleOutputGeometry(this,loc,&(publicType->shaderQualifiers).geometry);
    goto LAB_003987a1;
  }
  if (uVar14 == 3) {
    if (TVar1 < (ElgQuads|ElgLines)) {
      if ((0x36eU >> (TVar1 & 0x1f) & 1) != 0) goto LAB_003987a1;
      if (TVar1 == ElgLineStrip) {
        pcVar10 = "line_strip";
      }
      else {
        if (TVar1 != ElgTriangleStrip) goto LAB_00398779;
        pcVar10 = "triangle_strip";
      }
    }
    else {
LAB_00398779:
      pcVar10 = "none";
    }
    pp_Var16 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar13 = "cannot apply to input";
    pcVar15 = "";
  }
  else {
    if (TVar1 < (ElgQuads|ElgLines)) {
      pcVar10 = (&PTR_anon_var_dwarf_89c8d6_0093c210)[(int)TVar1];
    }
    else {
      pcVar10 = "none";
    }
    if (uVar14 < 0x1f) {
      pcVar15 = (&PTR_anon_var_dwarf_bac4b0_0093c260)[uVar11 & 0x7f];
    }
    else {
      pcVar15 = "unknown qualifier";
    }
    pp_Var16 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar13 = "cannot apply to:";
  }
  (*pp_Var16[0x2d])(this,loc,pcVar13,pcVar10,pcVar15);
LAB_003987a1:
  TVar2 = (publicType->shaderQualifiers).spacing;
  if ((TVar2 != EvsNone) &&
     (pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate,
     pTVar4->vertexSpacing == EvsNone)) {
    pTVar4->vertexSpacing = TVar2;
  }
  TVar3 = (publicType->shaderQualifiers).order;
  if ((TVar3 != EvoNone) &&
     (pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate,
     pTVar4->vertexOrder == EvoNone)) {
    pTVar4->vertexOrder = TVar3;
  }
  if ((publicType->shaderQualifiers).pointMode == true) {
    ((this->super_TParseContextBase).super_TParseVersions.intermediate)->pointMode = true;
  }
  lVar17 = 0;
  iVar18 = 0;
  do {
    if (1 < *(int *)((long)(publicType->shaderQualifiers).localSize + lVar17)) {
      if (iVar18 == 2) {
        uVar11 = (this->super_TParseContextBase).resources.maxComputeWorkGroupSizeZ;
      }
      else if (iVar18 == 1) {
        uVar11 = (this->super_TParseContextBase).resources.maxComputeWorkGroupSizeY;
      }
      else {
        uVar11 = 0;
        if (iVar18 == 0) {
          uVar11 = (this->super_TParseContextBase).resources.maxComputeWorkGroupSizeX;
        }
      }
      if (uVar11 < *(uint *)((long)((this->super_TParseContextBase).super_TParseVersions.
                                   intermediate)->localSize + lVar17)) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"too large; see gl_MaxComputeWorkGroupSize","local_size","");
      }
      iVar7 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4f])
                        (this,"gl_WorkGroupSize");
      lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar7) + 0xc0))
                        ((long *)CONCAT44(extraout_var,iVar7));
      lVar8 = *(long *)(*(long *)(lVar8 + 8) + 8);
      *(undefined4 *)(lVar8 + lVar17 * 4) =
           *(undefined4 *)
            ((long)((this->super_TParseContextBase).super_TParseVersions.intermediate)->localSize +
            lVar17);
      *(undefined4 *)(lVar8 + 8 + lVar17 * 4) = 9;
    }
    iVar7 = *(int *)((long)(publicType->shaderQualifiers).localSizeSpecId + lVar17);
    if (iVar7 != -1) {
      pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      if (*(int *)((long)pTVar4->localSizeSpecId + lVar17) == -1) {
        *(int *)((long)pTVar4->localSizeSpecId + lVar17) = iVar7;
      }
      iVar7 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4f])
                        (this,"gl_WorkGroupSize");
      plVar9 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 0x68))
                                 ((long *)CONCAT44(extraout_var_00,iVar7));
      lVar8 = (**(code **)(*plVar9 + 0x50))(plVar9);
      *(byte *)(lVar8 + 0xc) = *(byte *)(lVar8 + 0xc) | 1;
    }
    iVar18 = iVar18 + 1;
    lVar17 = lVar17 + 4;
  } while (lVar17 != 0xc);
  if ((publicType->shaderQualifiers).earlyFragmentTests != false) {
    ((this->super_TParseContextBase).super_TParseVersions.intermediate)->earlyFragmentTests = true;
  }
  uVar5 = *(ulong *)&(publicType->qualifier).field_0x8;
  switch((uint)uVar5 & 0x7f) {
  case 3:
    break;
  case 4:
    if ((publicType->qualifier).field_0x23 != -1) {
      *(ulong *)&(this->globalOutputDefaults).field_0x1c =
           *(ulong *)&(this->globalOutputDefaults).field_0x1c & 0xffffffffffffff |
           *(ulong *)&(publicType->qualifier).field_0x1c & 0xff00000000000000;
    }
    if ((~*(uint *)&(publicType->qualifier).field_0x24 & 0xf) != 0) {
      *(ulong *)&(this->globalOutputDefaults).field_0x24 =
           *(ulong *)&(this->globalOutputDefaults).field_0x24 & 0xfffffffffffffff0 |
           (ulong)((uint)*(undefined8 *)&(publicType->qualifier).field_0x24 & 0xf);
    }
    if (((~*(uint *)&(this->globalOutputDefaults).field_0x24 & 0xf) != 0) &&
       ((~*(uint *)&(publicType->qualifier).field_0x24 & 0x3fff0) != 0)) {
      uVar12 = (uint)*(undefined8 *)&(this->globalOutputDefaults).field_0x24 & 0xf;
      uVar14 = *(uint *)&(publicType->qualifier).field_0x24 >> 4 & 0x3fff;
      pTVar6 = (((this->super_TParseContextBase).super_TParseVersions.intermediate)->xfbBuffers).
               super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl
               .super__Vector_impl_data._M_start;
      uVar11 = pTVar6[uVar12].stride;
      if (uVar11 == 0x3fff) {
        pTVar6[uVar12].stride = uVar14;
      }
      else if (uVar11 != uVar14) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"all stride settings must match for xfb buffer","xfb_stride","%d",
                   (ulong)(*(uint *)&(publicType->qualifier).field_0x24 & 0xf));
        return;
      }
    }
    break;
  case 5:
    if (*(ulong *)&(publicType->qualifier).field_0x8 >> 0x3d != 0) {
      *(ulong *)&(this->globalUniformDefaults).field_0x8 =
           *(ulong *)&(this->globalUniformDefaults).field_0x8 & 0x1fffffffffffffff |
           uVar5 & 0xe000000000000000;
    }
    if (((publicType->qualifier).field_0x10 & 0xf) != 0) {
      (this->globalUniformDefaults).field_0x10 =
           (this->globalUniformDefaults).field_0x10 & 0xf0 |
           (publicType->qualifier).field_0x10 & 0xf;
    }
    break;
  case 6:
    if (*(ulong *)&(publicType->qualifier).field_0x8 >> 0x3d != 0) {
      *(ulong *)&(this->globalBufferDefaults).field_0x8 =
           *(ulong *)&(this->globalBufferDefaults).field_0x8 & 0x1fffffffffffffff |
           uVar5 & 0xe000000000000000;
    }
    if (((publicType->qualifier).field_0x10 & 0xf) != 0) {
      (this->globalBufferDefaults).field_0x10 =
           (this->globalBufferDefaults).field_0x10 & 0xf0 | (publicType->qualifier).field_0x10 & 0xf
      ;
    }
    break;
  default:
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    (*UNRECOVERED_JUMPTABLE)
              (this,loc,
               "default qualifier requires \'uniform\', \'buffer\', \'in\', or \'out\' storage qualification"
               ,"","",UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

void HlslParseContext::updateStandaloneQualifierDefaults(const TSourceLoc& loc, const TPublicType& publicType)
{
    if (publicType.shaderQualifiers.vertices != TQualifier::layoutNotSet) {
        assert(language == EShLangTessControl || language == EShLangGeometry);
        // const char* id = (language == EShLangTessControl) ? "vertices" : "max_vertices";
    }
    if (publicType.shaderQualifiers.invocations != TQualifier::layoutNotSet) {
        if (! intermediate.setInvocations(publicType.shaderQualifiers.invocations))
            error(loc, "cannot change previously set layout value", "invocations", "");
    }
    if (publicType.shaderQualifiers.geometry != ElgNone) {
        if (publicType.qualifier.storage == EvqVaryingIn) {
            switch (publicType.shaderQualifiers.geometry) {
            case ElgPoints:
            case ElgLines:
            case ElgLinesAdjacency:
            case ElgTriangles:
            case ElgTrianglesAdjacency:
            case ElgQuads:
            case ElgIsolines:
                break;
            default:
                error(loc, "cannot apply to input", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry),
                      "");
            }
        } else if (publicType.qualifier.storage == EvqVaryingOut) {
            handleOutputGeometry(loc, publicType.shaderQualifiers.geometry);
        } else
            error(loc, "cannot apply to:", TQualifier::getGeometryString(publicType.shaderQualifiers.geometry),
                  GetStorageQualifierString(publicType.qualifier.storage));
    }
    if (publicType.shaderQualifiers.spacing != EvsNone)
        intermediate.setVertexSpacing(publicType.shaderQualifiers.spacing);
    if (publicType.shaderQualifiers.order != EvoNone)
        intermediate.setVertexOrder(publicType.shaderQualifiers.order);
    if (publicType.shaderQualifiers.pointMode)
        intermediate.setPointMode();
    for (int i = 0; i < 3; ++i) {
        if (publicType.shaderQualifiers.localSize[i] > 1) {
            int max = 0;
            switch (i) {
            case 0: max = resources.maxComputeWorkGroupSizeX; break;
            case 1: max = resources.maxComputeWorkGroupSizeY; break;
            case 2: max = resources.maxComputeWorkGroupSizeZ; break;
            default: break;
            }
            if (intermediate.getLocalSize(i) > (unsigned int)max)
                error(loc, "too large; see gl_MaxComputeWorkGroupSize", "local_size", "");

            // Fix the existing constant gl_WorkGroupSize with this new information.
            TVariable* workGroupSize = getEditableVariable("gl_WorkGroupSize");
            workGroupSize->getWritableConstArray()[i].setUConst(intermediate.getLocalSize(i));
        }
        if (publicType.shaderQualifiers.localSizeSpecId[i] != TQualifier::layoutNotSet) {
            intermediate.setLocalSizeSpecId(i, publicType.shaderQualifiers.localSizeSpecId[i]);
            // Set the workgroup built-in variable as a specialization constant
            TVariable* workGroupSize = getEditableVariable("gl_WorkGroupSize");
            workGroupSize->getWritableType().getQualifier().specConstant = true;
        }
    }
    if (publicType.shaderQualifiers.earlyFragmentTests)
        intermediate.setEarlyFragmentTests();

    const TQualifier& qualifier = publicType.qualifier;

    switch (qualifier.storage) {
    case EvqUniform:
        if (qualifier.hasMatrix())
            globalUniformDefaults.layoutMatrix = qualifier.layoutMatrix;
        if (qualifier.hasPacking())
            globalUniformDefaults.layoutPacking = qualifier.layoutPacking;
        break;
    case EvqBuffer:
        if (qualifier.hasMatrix())
            globalBufferDefaults.layoutMatrix = qualifier.layoutMatrix;
        if (qualifier.hasPacking())
            globalBufferDefaults.layoutPacking = qualifier.layoutPacking;
        break;
    case EvqVaryingIn:
        break;
    case EvqVaryingOut:
        if (qualifier.hasStream())
            globalOutputDefaults.layoutStream = qualifier.layoutStream;
        if (qualifier.hasXfbBuffer())
            globalOutputDefaults.layoutXfbBuffer = qualifier.layoutXfbBuffer;
        if (globalOutputDefaults.hasXfbBuffer() && qualifier.hasXfbStride()) {
            if (! intermediate.setXfbBufferStride(globalOutputDefaults.layoutXfbBuffer, qualifier.layoutXfbStride))
                error(loc, "all stride settings must match for xfb buffer", "xfb_stride", "%d",
                      qualifier.layoutXfbBuffer);
        }
        break;
    default:
        error(loc, "default qualifier requires 'uniform', 'buffer', 'in', or 'out' storage qualification", "", "");
        return;
    }
}